

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

Host * host_new(HostInit *init,Emulator *e)

{
  Result RVar1;
  Host *host;
  Emulator *e_local;
  HostInit *init_local;
  
  init_local = (HostInit *)calloc(1,0x2c8);
  memcpy(init_local,init,0x60);
  (((Host *)init_local)->hook_ctx).host = (Host *)init_local;
  (((Host *)init_local)->hook_ctx).e = e;
  (((Host *)init_local)->hook_ctx).user_data = (((Host *)init_local)->init).hooks.user_data;
  RVar1 = host_init((Host *)init_local,e);
  if (RVar1 != OK) {
    free(init_local);
    init_local = (HostInit *)0x0;
  }
  return (Host *)init_local;
}

Assistant:

Host* host_new(const HostInit *init, Emulator* e) {
  Host* host = xcalloc(1, sizeof(Host));
  host->init = *init;
  host->hook_ctx.host = host;
  host->hook_ctx.e = e;
  host->hook_ctx.user_data = host->init.hooks.user_data;
  CHECK(SUCCESS(host_init(host, e)));
  return host;
error:
  xfree(host);
  return NULL;
}